

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

void __thiscall
pbrt::detail::DispatchSplitCPU<4>::operator()
          (void *param_1,undefined8 param_2,
          TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          *param_3,int param_4)

{
  int mid;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_58;
  undefined8 local_50;
  DispatchSplitCPU<2> local_42 [2];
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_40;
  undefined8 local_38;
  DispatchSplitCPU<2> local_29;
  undefined4 local_28;
  int local_24;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  *local_20;
  void *local_18;
  undefined8 local_8;
  
  local_28 = 2;
  local_24 = param_4;
  local_20 = param_3;
  local_18 = param_1;
  local_8 = param_2;
  if (param_4 + -1 < 2) {
    local_38 = param_2;
    TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
    ::TaggedPointer(&local_40,param_3);
    DispatchSplitCPU<2>::operator()(&local_29,local_38,&local_40,local_24);
  }
  else {
    local_50 = param_2;
    TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
    ::TaggedPointer(&local_58,param_3);
    DispatchSplitCPU<2>::operator()(local_42,local_50,&local_58,local_24 + -2);
  }
  return;
}

Assistant:

inline auto operator()(F func, Tp tp, int tag, TypePack<Ts...> types) {
        constexpr int mid = n / 2;

        if (tag - 1 < mid)  // 0-based indexing here to be more traditional
            return DispatchSplitCPU<mid>()(
                func, tp, tag, typename TakeFirstN<mid, TypePack<Ts...>>::type());
        else
            return DispatchSplitCPU<n - mid>()(
                func, tp, tag - mid, typename RemoveFirstN<mid, TypePack<Ts...>>::type());
    }